

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

void Cmd_printstats(FCommandLine *argv,APlayerPawn *who,int key)

{
  FString local_10;
  
  StoreLevelStats();
  GetStatString();
  Printf("%s",local_10.Chars);
  FString::~FString(&local_10);
  return;
}

Assistant:

CCMD(printstats)
{
	StoreLevelStats();	// Refresh the current level's results.
	Printf("%s", GetStatString().GetChars());
}